

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint256_tests.cpp
# Opt level: O1

void __thiscall uint256_tests::conversion::test_method(conversion *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t sVar2;
  bool bVar3;
  int iVar4;
  iterator in_R8;
  iterator pvVar5;
  iterator in_R9;
  iterator pvVar6;
  long in_FS_OFFSET;
  readonly_property<bool> rVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  string_view str;
  const_string file_08;
  string_view str_00;
  const_string file_09;
  const_string file_10;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  undefined1 *local_2d0;
  undefined1 *local_2c8;
  char *local_2c0;
  char *local_2b8;
  undefined1 *local_2b0;
  undefined1 *local_2a8;
  char *local_2a0;
  char *local_298;
  undefined1 *local_290;
  undefined1 *local_288;
  char *local_280;
  char *local_278;
  undefined1 *local_270;
  undefined1 *local_268;
  char *local_260;
  char *local_258;
  undefined1 *local_250;
  undefined1 *local_248;
  char *local_240;
  char *local_238;
  undefined1 *local_230;
  undefined1 *local_228;
  char *local_220;
  char *local_218;
  undefined1 *local_210;
  undefined1 *local_208;
  char *local_200;
  char *local_1f8;
  undefined1 *local_1f0;
  undefined1 *local_1e8;
  char *local_1e0;
  char *local_1d8;
  undefined1 *local_1d0;
  undefined1 *local_1c8;
  char *local_1c0;
  char *local_1b8;
  undefined1 *local_1b0;
  undefined1 *local_1a8;
  char *local_1a0;
  char *local_198;
  undefined1 *local_190;
  undefined1 *local_188;
  char *local_180;
  char *local_178;
  lazy_ostream local_170;
  undefined1 *local_160;
  char *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  char *local_140;
  char *local_138;
  arith_uint256 *local_130;
  undefined1 local_128 [16];
  assertion_result local_118;
  string *local_100;
  undefined **local_f8;
  undefined1 local_f0;
  undefined1 *local_e8;
  string **local_e0;
  undefined **local_d8;
  undefined1 local_d0;
  undefined1 *local_c8;
  string **local_c0;
  undefined1 local_b8 [8];
  shared_ptr<boost::basic_wrap_stringstream<char>_> sStack_b0;
  uchar uStack_a0;
  uchar uStack_9f;
  uchar uStack_9e;
  uchar uStack_9d;
  uchar uStack_9c;
  uchar uStack_9b;
  uchar uStack_9a;
  uchar uStack_99;
  undefined1 local_98 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_88;
  uint256 rv;
  readonly_property<bool> local_58;
  uchar uStack_57;
  uchar uStack_56;
  uchar uStack_55;
  uchar uStack_54;
  uchar uStack_53;
  uchar uStack_52;
  uchar uStack_51;
  uchar uStack_50;
  uchar uStack_4f;
  uchar uStack_4e;
  uchar uStack_4d;
  uchar uStack_4c;
  uchar uStack_4b;
  uchar uStack_4a;
  uchar uStack_49;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  long local_38;
  
  sStack_b0.pn.pi_ = (sp_counted_base *)sStack_b0.px;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_140 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_138 = "";
  local_150 = &boost::unit_test::basic_cstring<char_const>::null;
  local_148 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x10d;
  file.m_begin = (iterator)&local_140;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_150,msg);
  local_170.m_empty = false;
  local_170._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_160 = boost::unit_test::lazy_ostream::inst;
  local_158 = "";
  UintToArith256((arith_uint256 *)&rv,(uint256 *)ZeroL);
  ArithToUint256((uint256 *)&local_58,(arith_uint256 *)&rv);
  auVar10[0] = -(local_58.super_class_property<bool>.value == (class_property<bool>)ZeroL[0]);
  auVar10[1] = -(uStack_57 == ZeroL[1]);
  auVar10[2] = -(uStack_56 == ZeroL[2]);
  auVar10[3] = -(uStack_55 == ZeroL[3]);
  auVar10[4] = -(uStack_54 == ZeroL[4]);
  auVar10[5] = -(uStack_53 == ZeroL[5]);
  auVar10[6] = -(uStack_52 == ZeroL[6]);
  auVar10[7] = -(uStack_51 == ZeroL[7]);
  auVar10[8] = -(uStack_50 == ZeroL[8]);
  auVar10[9] = -(uStack_4f == ZeroL[9]);
  auVar10[10] = -(uStack_4e == ZeroL[10]);
  auVar10[0xb] = -(uStack_4d == ZeroL[0xb]);
  auVar10[0xc] = -(uStack_4c == ZeroL[0xc]);
  auVar10[0xd] = -(uStack_4b == ZeroL[0xd]);
  auVar10[0xe] = -(uStack_4a == ZeroL[0xe]);
  auVar10[0xf] = -(uStack_49 == ZeroL[0xf]);
  auVar16[0] = -(ZeroL[0x10] == local_48._M_local_buf[0]);
  auVar16[1] = -(ZeroL[0x11] == local_48._M_local_buf[1]);
  auVar16[2] = -(ZeroL[0x12] == local_48._M_local_buf[2]);
  auVar16[3] = -(ZeroL[0x13] == local_48._M_local_buf[3]);
  auVar16[4] = -(ZeroL[0x14] == local_48._M_local_buf[4]);
  auVar16[5] = -(ZeroL[0x15] == local_48._M_local_buf[5]);
  auVar16[6] = -(ZeroL[0x16] == local_48._M_local_buf[6]);
  auVar16[7] = -(ZeroL[0x17] == local_48._M_local_buf[7]);
  auVar16[8] = -(ZeroL[0x18] == local_48._M_local_buf[8]);
  auVar16[9] = -(ZeroL[0x19] == local_48._M_local_buf[9]);
  auVar16[10] = -(ZeroL[0x1a] == local_48._M_local_buf[10]);
  auVar16[0xb] = -(ZeroL[0x1b] == local_48._M_local_buf[0xb]);
  auVar16[0xc] = -(ZeroL[0x1c] == local_48._M_local_buf[0xc]);
  auVar16[0xd] = -(ZeroL[0x1d] == local_48._M_local_buf[0xd]);
  auVar16[0xe] = -(ZeroL[0x1e] == local_48._M_local_buf[0xe]);
  auVar16[0xf] = -(ZeroL[0x1f] == local_48._M_local_buf[0xf]);
  auVar16 = auVar16 & auVar10;
  local_98._8_8_ = (element_type *)0x0;
  aStack_88._M_allocated_capacity = (size_type)(sp_counted_base *)0x0;
  local_b8 = (undefined1  [8])0xf96670;
  sStack_b0.px = (element_type *)0xf966cf;
  local_d0 = 0;
  local_d8 = &PTR__lazy_ostream_013d4988;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = (string **)local_128;
  local_128._0_8_ = ZeroL;
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_013d4988;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  local_118._0_8_ = (uint256 *)&local_58;
  local_c0 = (string **)&local_118;
  local_98[0] = (class_property<bool>)
                (class_property<bool>)
                ((ushort)((ushort)(SUB161(auVar16 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar16 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar16 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar16 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar16 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar16 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar16 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar16 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar16 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar16 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar16 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar16 >> 0x77,0) & 1) << 0xe |
                         (ushort)(byte)(auVar16[0xf] >> 7) << 0xf) == 0xffff);
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_98,&local_170,1,2,REQUIRE,0xf97253,(size_t)local_b8,0x10d,
             &local_d8,"ZeroL",&local_f8);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_88._M_allocated_capacity);
  local_180 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_178 = "";
  local_190 = &boost::unit_test::basic_cstring<char_const>::null;
  local_188 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x10e;
  file_00.m_begin = (iterator)&local_180;
  msg_00.m_end = pvVar6;
  msg_00.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_190,
             msg_00);
  local_170.m_empty = false;
  local_170._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_160 = boost::unit_test::lazy_ostream::inst;
  local_158 = "";
  UintToArith256((arith_uint256 *)&rv,(uint256 *)OneL);
  ArithToUint256((uint256 *)&local_58,(arith_uint256 *)&rv);
  auVar11[0] = -(local_58.super_class_property<bool>.value == (class_property<bool>)OneL[0]);
  auVar11[1] = -(uStack_57 == OneL[1]);
  auVar11[2] = -(uStack_56 == OneL[2]);
  auVar11[3] = -(uStack_55 == OneL[3]);
  auVar11[4] = -(uStack_54 == OneL[4]);
  auVar11[5] = -(uStack_53 == OneL[5]);
  auVar11[6] = -(uStack_52 == OneL[6]);
  auVar11[7] = -(uStack_51 == OneL[7]);
  auVar11[8] = -(uStack_50 == OneL[8]);
  auVar11[9] = -(uStack_4f == OneL[9]);
  auVar11[10] = -(uStack_4e == OneL[10]);
  auVar11[0xb] = -(uStack_4d == OneL[0xb]);
  auVar11[0xc] = -(uStack_4c == OneL[0xc]);
  auVar11[0xd] = -(uStack_4b == OneL[0xd]);
  auVar11[0xe] = -(uStack_4a == OneL[0xe]);
  auVar11[0xf] = -(uStack_49 == OneL[0xf]);
  auVar17[0] = -(OneL[0x10] == local_48._M_local_buf[0]);
  auVar17[1] = -(OneL[0x11] == local_48._M_local_buf[1]);
  auVar17[2] = -(OneL[0x12] == local_48._M_local_buf[2]);
  auVar17[3] = -(OneL[0x13] == local_48._M_local_buf[3]);
  auVar17[4] = -(OneL[0x14] == local_48._M_local_buf[4]);
  auVar17[5] = -(OneL[0x15] == local_48._M_local_buf[5]);
  auVar17[6] = -(OneL[0x16] == local_48._M_local_buf[6]);
  auVar17[7] = -(OneL[0x17] == local_48._M_local_buf[7]);
  auVar17[8] = -(OneL[0x18] == local_48._M_local_buf[8]);
  auVar17[9] = -(OneL[0x19] == local_48._M_local_buf[9]);
  auVar17[10] = -(OneL[0x1a] == local_48._M_local_buf[10]);
  auVar17[0xb] = -(OneL[0x1b] == local_48._M_local_buf[0xb]);
  auVar17[0xc] = -(OneL[0x1c] == local_48._M_local_buf[0xc]);
  auVar17[0xd] = -(OneL[0x1d] == local_48._M_local_buf[0xd]);
  auVar17[0xe] = -(OneL[0x1e] == local_48._M_local_buf[0xe]);
  auVar17[0xf] = -(OneL[0x1f] == local_48._M_local_buf[0xf]);
  auVar17 = auVar17 & auVar11;
  local_98[0] = (class_property<bool>)
                ((ushort)((ushort)(SUB161(auVar17 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe |
                         (ushort)(byte)(auVar17[0xf] >> 7) << 0xf) == 0xffff);
  local_98._8_8_ = (element_type *)0x0;
  aStack_88._M_allocated_capacity = (size_type)(sp_counted_base *)0x0;
  local_b8 = (undefined1  [8])0xf96670;
  sStack_b0.px = (element_type *)0xf966cf;
  local_d0 = 0;
  local_d8 = &PTR__lazy_ostream_013d4988;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_128._0_8_ = OneL;
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_013d4988;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = (string **)local_128;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  local_118._0_8_ = (uint256 *)&local_58;
  local_c0 = (string **)&local_118;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_98,&local_170,1,2,REQUIRE,0xf97279,(size_t)local_b8,0x10e,
             &local_d8,"OneL",&local_f8);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_88._M_allocated_capacity);
  local_1a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_198 = "";
  local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x10f;
  file_01.m_begin = (iterator)&local_1a0;
  msg_01.m_end = pvVar6;
  msg_01.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_1b0,
             msg_01);
  local_170.m_empty = false;
  local_170._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_160 = boost::unit_test::lazy_ostream::inst;
  local_158 = "";
  UintToArith256((arith_uint256 *)&rv,(uint256 *)&R1L);
  ArithToUint256((uint256 *)&local_58,(arith_uint256 *)&rv);
  auVar12[0] = -(local_58.super_class_property<bool>.value == (class_property<bool>)R1L);
  auVar12[1] = -(uStack_57 == uRam00000000013ed452);
  auVar12[2] = -(uStack_56 == uRam00000000013ed453);
  auVar12[3] = -(uStack_55 == uRam00000000013ed454);
  auVar12[4] = -(uStack_54 == uRam00000000013ed455);
  auVar12[5] = -(uStack_53 == uRam00000000013ed456);
  auVar12[6] = -(uStack_52 == uRam00000000013ed457);
  auVar12[7] = -(uStack_51 == uRam00000000013ed458);
  auVar12[8] = -(uStack_50 == uRam00000000013ed459);
  auVar12[9] = -(uStack_4f == uRam00000000013ed45a);
  auVar12[10] = -(uStack_4e == uRam00000000013ed45b);
  auVar12[0xb] = -(uStack_4d == uRam00000000013ed45c);
  auVar12[0xc] = -(uStack_4c == uRam00000000013ed45d);
  auVar12[0xd] = -(uStack_4b == uRam00000000013ed45e);
  auVar12[0xe] = -(uStack_4a == uRam00000000013ed45f);
  auVar12[0xf] = -(uStack_49 == uRam00000000013ed460);
  auVar18[0] = -(DAT_013ed461 == local_48._M_local_buf[0]);
  auVar18[1] = -(uRam00000000013ed462 == local_48._M_local_buf[1]);
  auVar18[2] = -(uRam00000000013ed463 == local_48._M_local_buf[2]);
  auVar18[3] = -(uRam00000000013ed464 == local_48._M_local_buf[3]);
  auVar18[4] = -(uRam00000000013ed465 == local_48._M_local_buf[4]);
  auVar18[5] = -(uRam00000000013ed466 == local_48._M_local_buf[5]);
  auVar18[6] = -(uRam00000000013ed467 == local_48._M_local_buf[6]);
  auVar18[7] = -(uRam00000000013ed468 == local_48._M_local_buf[7]);
  auVar18[8] = -(uRam00000000013ed469 == local_48._M_local_buf[8]);
  auVar18[9] = -(uRam00000000013ed46a == local_48._M_local_buf[9]);
  auVar18[10] = -(uRam00000000013ed46b == local_48._M_local_buf[10]);
  auVar18[0xb] = -(uRam00000000013ed46c == local_48._M_local_buf[0xb]);
  auVar18[0xc] = -(uRam00000000013ed46d == local_48._M_local_buf[0xc]);
  auVar18[0xd] = -(uRam00000000013ed46e == local_48._M_local_buf[0xd]);
  auVar18[0xe] = -(uRam00000000013ed46f == local_48._M_local_buf[0xe]);
  auVar18[0xf] = -(DAT_013ed470 == local_48._M_local_buf[0xf]);
  auVar18 = auVar18 & auVar12;
  local_98[0] = (class_property<bool>)
                ((ushort)((ushort)(SUB161(auVar18 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe |
                         (ushort)(byte)(auVar18[0xf] >> 7) << 0xf) == 0xffff);
  local_98._8_8_ = (element_type *)0x0;
  aStack_88._M_allocated_capacity = (size_type)(sp_counted_base *)0x0;
  local_b8 = (undefined1  [8])0xf96670;
  sStack_b0.px = (element_type *)0xf966cf;
  local_d0 = 0;
  local_d8 = &PTR__lazy_ostream_013d4988;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_128._0_8_ = &R1L;
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_013d4988;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = (string **)local_128;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  local_118._0_8_ = (uint256 *)&local_58;
  local_c0 = (string **)&local_118;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_98,&local_170,1,2,REQUIRE,0xf9729e,(size_t)local_b8,0x10f,
             &local_d8,"R1L",&local_f8);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_88._M_allocated_capacity);
  local_1c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_1b8 = "";
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x110;
  file_02.m_begin = (iterator)&local_1c0;
  msg_02.m_end = pvVar6;
  msg_02.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_1d0,
             msg_02);
  local_170.m_empty = false;
  local_170._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_160 = boost::unit_test::lazy_ostream::inst;
  local_158 = "";
  UintToArith256((arith_uint256 *)&rv,(uint256 *)&R2L);
  ArithToUint256((uint256 *)&local_58,(arith_uint256 *)&rv);
  auVar13[0] = -(local_58.super_class_property<bool>.value == (class_property<bool>)R2L);
  auVar13[1] = -(uStack_57 == uRam00000000013ed486);
  auVar13[2] = -(uStack_56 == uRam00000000013ed487);
  auVar13[3] = -(uStack_55 == uRam00000000013ed488);
  auVar13[4] = -(uStack_54 == uRam00000000013ed489);
  auVar13[5] = -(uStack_53 == uRam00000000013ed48a);
  auVar13[6] = -(uStack_52 == uRam00000000013ed48b);
  auVar13[7] = -(uStack_51 == uRam00000000013ed48c);
  auVar13[8] = -(uStack_50 == uRam00000000013ed48d);
  auVar13[9] = -(uStack_4f == uRam00000000013ed48e);
  auVar13[10] = -(uStack_4e == uRam00000000013ed48f);
  auVar13[0xb] = -(uStack_4d == uRam00000000013ed490);
  auVar13[0xc] = -(uStack_4c == uRam00000000013ed491);
  auVar13[0xd] = -(uStack_4b == uRam00000000013ed492);
  auVar13[0xe] = -(uStack_4a == uRam00000000013ed493);
  auVar13[0xf] = -(uStack_49 == uRam00000000013ed494);
  auVar19[0] = -(DAT_013ed495 == local_48._M_local_buf[0]);
  auVar19[1] = -(uRam00000000013ed496 == local_48._M_local_buf[1]);
  auVar19[2] = -(uRam00000000013ed497 == local_48._M_local_buf[2]);
  auVar19[3] = -(uRam00000000013ed498 == local_48._M_local_buf[3]);
  auVar19[4] = -(uRam00000000013ed499 == local_48._M_local_buf[4]);
  auVar19[5] = -(uRam00000000013ed49a == local_48._M_local_buf[5]);
  auVar19[6] = -(uRam00000000013ed49b == local_48._M_local_buf[6]);
  auVar19[7] = -(uRam00000000013ed49c == local_48._M_local_buf[7]);
  auVar19[8] = -(uRam00000000013ed49d == local_48._M_local_buf[8]);
  auVar19[9] = -(uRam00000000013ed49e == local_48._M_local_buf[9]);
  auVar19[10] = -(uRam00000000013ed49f == local_48._M_local_buf[10]);
  auVar19[0xb] = -(uRam00000000013ed4a0 == local_48._M_local_buf[0xb]);
  auVar19[0xc] = -(uRam00000000013ed4a1 == local_48._M_local_buf[0xc]);
  auVar19[0xd] = -(uRam00000000013ed4a2 == local_48._M_local_buf[0xd]);
  auVar19[0xe] = -(uRam00000000013ed4a3 == local_48._M_local_buf[0xe]);
  auVar19[0xf] = -(DAT_013ed4a4 == local_48._M_local_buf[0xf]);
  auVar19 = auVar19 & auVar13;
  local_98[0] = (class_property<bool>)
                (class_property<bool>)
                ((ushort)((ushort)(SUB161(auVar19 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar19 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar19 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar19 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar19 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar19 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar19 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar19 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar19 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar19 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar19 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar19 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar19 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar19 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar19 >> 0x77,0) & 1) << 0xe |
                         (ushort)(byte)(auVar19[0xf] >> 7) << 0xf) == 0xffff);
  local_98._8_8_ = (element_type *)0x0;
  aStack_88._M_allocated_capacity = (size_type)(sp_counted_base *)0x0;
  local_b8 = (undefined1  [8])0xf96670;
  sStack_b0.px = (element_type *)0xf966cf;
  local_d0 = 0;
  local_d8 = &PTR__lazy_ostream_013d4988;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_c0 = (string **)&local_118;
  local_128._0_8_ = &R2L;
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_013d4988;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = (string **)local_128;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  local_118._0_8_ = (uint256 *)&local_58;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_98,&local_170,1,2,REQUIRE,0xf972c2,(size_t)local_b8,0x110,
             &local_d8,"R2L",&local_f8);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_88._M_allocated_capacity);
  local_1e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_1d8 = "";
  local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x111;
  file_03.m_begin = (iterator)&local_1e0;
  msg_03.m_end = pvVar6;
  msg_03.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_1f0,
             msg_03);
  local_170.m_empty = false;
  local_170._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_160 = boost::unit_test::lazy_ostream::inst;
  local_158 = "";
  UintToArith256((arith_uint256 *)&local_58,(uint256 *)ZeroL);
  local_128._0_8_ = local_128._0_8_ & 0xffffffff00000000;
  bVar3 = base_uint<256U>::EqualTo((base_uint<256U> *)&local_58,0);
  rv.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  local_98._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_98._8_8_ = "";
  local_d0 = 0;
  local_d8 = &PTR__lazy_ostream_013d46d8;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_118._0_8_ = local_128;
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_013d3e70;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = (string **)&local_118;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  local_c0 = (string **)local_b8;
  local_b8 = (undefined1  [8])&local_58;
  rv.super_base_blob<256U>.m_data._M_elems[0] = bVar3;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&rv,&local_170,1,2,REQUIRE,0xf972e6,(size_t)local_98,0x111,
             &local_d8,"0",&local_f8);
  boost::detail::shared_count::~shared_count
            ((shared_count *)(rv.super_base_blob<256U>.m_data._M_elems + 0x10));
  local_200 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_1f8 = "";
  local_210 = &boost::unit_test::basic_cstring<char_const>::null;
  local_208 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x112;
  file_04.m_begin = (iterator)&local_200;
  msg_04.m_end = pvVar6;
  msg_04.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_210,
             msg_04);
  local_170.m_empty = false;
  local_170._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_160 = boost::unit_test::lazy_ostream::inst;
  local_158 = "";
  UintToArith256((arith_uint256 *)&local_58,(uint256 *)OneL);
  local_128._0_4_ = 1;
  rv.super_base_blob<256U>.m_data._M_elems[0] =
       base_uint<256U>::EqualTo((base_uint<256U> *)&local_58,1);
  rv.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  local_98._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_98._8_8_ = (element_type *)0xf966cf;
  local_d0 = 0;
  local_d8 = &PTR__lazy_ostream_013d46d8;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_118._0_8_ = local_128;
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_013d3e70;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  local_e0 = (string **)&local_118;
  local_c0 = (string **)local_b8;
  local_b8 = (undefined1  [8])&local_58;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&rv,&local_170,1,2,REQUIRE,0xf972fc,(size_t)local_98,0x112,
             &local_d8,"1",&local_f8);
  boost::detail::shared_count::~shared_count
            ((shared_count *)(rv.super_base_blob<256U>.m_data._M_elems + 0x10));
  local_220 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_218 = "";
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  local_228 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x113;
  file_05.m_begin = (iterator)&local_220;
  msg_05.m_end = pvVar6;
  msg_05.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_230,
             msg_05);
  local_170.m_empty = false;
  local_170._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_160 = boost::unit_test::lazy_ostream::inst;
  local_158 = "";
  rv.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  ArithToUint256((uint256 *)&local_58,(arith_uint256 *)&rv);
  auVar14[0] = -(local_58.super_class_property<bool>.value == (class_property<bool>)ZeroL[0]);
  auVar14[1] = -(uStack_57 == ZeroL[1]);
  auVar14[2] = -(uStack_56 == ZeroL[2]);
  auVar14[3] = -(uStack_55 == ZeroL[3]);
  auVar14[4] = -(uStack_54 == ZeroL[4]);
  auVar14[5] = -(uStack_53 == ZeroL[5]);
  auVar14[6] = -(uStack_52 == ZeroL[6]);
  auVar14[7] = -(uStack_51 == ZeroL[7]);
  auVar14[8] = -(uStack_50 == ZeroL[8]);
  auVar14[9] = -(uStack_4f == ZeroL[9]);
  auVar14[10] = -(uStack_4e == ZeroL[10]);
  auVar14[0xb] = -(uStack_4d == ZeroL[0xb]);
  auVar14[0xc] = -(uStack_4c == ZeroL[0xc]);
  auVar14[0xd] = -(uStack_4b == ZeroL[0xd]);
  auVar14[0xe] = -(uStack_4a == ZeroL[0xe]);
  auVar14[0xf] = -(uStack_49 == ZeroL[0xf]);
  auVar20[0] = -(ZeroL[0x10] == local_48._M_local_buf[0]);
  auVar20[1] = -(ZeroL[0x11] == local_48._M_local_buf[1]);
  auVar20[2] = -(ZeroL[0x12] == local_48._M_local_buf[2]);
  auVar20[3] = -(ZeroL[0x13] == local_48._M_local_buf[3]);
  auVar20[4] = -(ZeroL[0x14] == local_48._M_local_buf[4]);
  auVar20[5] = -(ZeroL[0x15] == local_48._M_local_buf[5]);
  auVar20[6] = -(ZeroL[0x16] == local_48._M_local_buf[6]);
  auVar20[7] = -(ZeroL[0x17] == local_48._M_local_buf[7]);
  auVar20[8] = -(ZeroL[0x18] == local_48._M_local_buf[8]);
  auVar20[9] = -(ZeroL[0x19] == local_48._M_local_buf[9]);
  auVar20[10] = -(ZeroL[0x1a] == local_48._M_local_buf[10]);
  auVar20[0xb] = -(ZeroL[0x1b] == local_48._M_local_buf[0xb]);
  auVar20[0xc] = -(ZeroL[0x1c] == local_48._M_local_buf[0xc]);
  auVar20[0xd] = -(ZeroL[0x1d] == local_48._M_local_buf[0xd]);
  auVar20[0xe] = -(ZeroL[0x1e] == local_48._M_local_buf[0xe]);
  auVar20[0xf] = -(ZeroL[0x1f] == local_48._M_local_buf[0xf]);
  auVar20 = auVar20 & auVar14;
  local_98._8_8_ = (element_type *)0x0;
  aStack_88._M_allocated_capacity = (size_type)(sp_counted_base *)0x0;
  local_b8 = (undefined1  [8])0xf96670;
  sStack_b0.px = (element_type *)0xf966cf;
  local_d0 = 0;
  local_d8 = &PTR__lazy_ostream_013d4988;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_128._0_8_ = ZeroL;
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_013d4988;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = (string **)local_128;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  local_118._0_8_ = (uint256 *)&local_58;
  local_c0 = (string **)&local_118;
  local_98[0] = (class_property<bool>)
                (class_property<bool>)
                ((ushort)((ushort)(SUB161(auVar20 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar20 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar20 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar20 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar20 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar20 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar20 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar20 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar20 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar20 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar20 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar20 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar20 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar20 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar20 >> 0x77,0) & 1) << 0xe |
                         (ushort)(byte)(auVar20[0xf] >> 7) << 0xf) == 0xffff);
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_98,&local_170,1,2,REQUIRE,0xf97311,(size_t)local_b8,0x113,
             &local_d8,"ZeroL",&local_f8);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_88._M_allocated_capacity);
  local_240 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_238 = "";
  local_250 = &boost::unit_test::basic_cstring<char_const>::null;
  local_248 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x114;
  file_06.m_begin = (iterator)&local_240;
  msg_06.m_end = pvVar6;
  msg_06.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_250,
             msg_06);
  local_170.m_empty = false;
  local_170._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_160 = boost::unit_test::lazy_ostream::inst;
  local_158 = "";
  rv.super_base_blob<256U>.m_data._M_elems[0] = '\x01';
  rv.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  ArithToUint256((uint256 *)&local_58,(arith_uint256 *)&rv);
  auVar15[0] = -(local_58.super_class_property<bool>.value == (class_property<bool>)OneL[0]);
  auVar15[1] = -(uStack_57 == OneL[1]);
  auVar15[2] = -(uStack_56 == OneL[2]);
  auVar15[3] = -(uStack_55 == OneL[3]);
  auVar15[4] = -(uStack_54 == OneL[4]);
  auVar15[5] = -(uStack_53 == OneL[5]);
  auVar15[6] = -(uStack_52 == OneL[6]);
  auVar15[7] = -(uStack_51 == OneL[7]);
  auVar15[8] = -(uStack_50 == OneL[8]);
  auVar15[9] = -(uStack_4f == OneL[9]);
  auVar15[10] = -(uStack_4e == OneL[10]);
  auVar15[0xb] = -(uStack_4d == OneL[0xb]);
  auVar15[0xc] = -(uStack_4c == OneL[0xc]);
  auVar15[0xd] = -(uStack_4b == OneL[0xd]);
  auVar15[0xe] = -(uStack_4a == OneL[0xe]);
  auVar15[0xf] = -(uStack_49 == OneL[0xf]);
  auVar21[0] = -(OneL[0x10] == local_48._M_local_buf[0]);
  auVar21[1] = -(OneL[0x11] == local_48._M_local_buf[1]);
  auVar21[2] = -(OneL[0x12] == local_48._M_local_buf[2]);
  auVar21[3] = -(OneL[0x13] == local_48._M_local_buf[3]);
  auVar21[4] = -(OneL[0x14] == local_48._M_local_buf[4]);
  auVar21[5] = -(OneL[0x15] == local_48._M_local_buf[5]);
  auVar21[6] = -(OneL[0x16] == local_48._M_local_buf[6]);
  auVar21[7] = -(OneL[0x17] == local_48._M_local_buf[7]);
  auVar21[8] = -(OneL[0x18] == local_48._M_local_buf[8]);
  auVar21[9] = -(OneL[0x19] == local_48._M_local_buf[9]);
  auVar21[10] = -(OneL[0x1a] == local_48._M_local_buf[10]);
  auVar21[0xb] = -(OneL[0x1b] == local_48._M_local_buf[0xb]);
  auVar21[0xc] = -(OneL[0x1c] == local_48._M_local_buf[0xc]);
  auVar21[0xd] = -(OneL[0x1d] == local_48._M_local_buf[0xd]);
  auVar21[0xe] = -(OneL[0x1e] == local_48._M_local_buf[0xe]);
  auVar21[0xf] = -(OneL[0x1f] == local_48._M_local_buf[0xf]);
  auVar21 = auVar21 & auVar15;
  local_98[0] = (class_property<bool>)
                (class_property<bool>)
                ((ushort)((ushort)(SUB161(auVar21 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar21 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar21 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar21 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar21 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar21 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar21 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar21 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar21 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar21 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar21 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar21 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar21 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar21 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar21 >> 0x77,0) & 1) << 0xe |
                         (ushort)(byte)(auVar21[0xf] >> 7) << 0xf) == 0xffff);
  local_98._8_8_ = (element_type *)0x0;
  aStack_88._M_allocated_capacity = (size_type)(sp_counted_base *)0x0;
  local_b8 = (undefined1  [8])0xf96670;
  sStack_b0.px = (element_type *)0xf966cf;
  local_d0 = 0;
  local_d8 = &PTR__lazy_ostream_013d4988;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_128._0_8_ = OneL;
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_013d4988;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = (string **)local_128;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  local_118._0_8_ = (uint256 *)&local_58;
  local_c0 = (string **)&local_118;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_98,&local_170,1,2,REQUIRE,0xf97323,(size_t)local_b8,0x114,
             &local_d8,"OneL",&local_f8);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_88._M_allocated_capacity);
  local_260 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_258 = "";
  local_270 = &boost::unit_test::basic_cstring<char_const>::null;
  local_268 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x115;
  file_07.m_begin = (iterator)&local_260;
  msg_07.m_end = pvVar6;
  msg_07.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_270,
             msg_07);
  local_170.m_empty = false;
  local_170._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_160 = boost::unit_test::lazy_ostream::inst;
  local_158 = "";
  base_blob<256u>::GetHex_abi_cxx11_((string *)local_98,&R1L);
  rv.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  str._M_str = (char *)local_98._0_8_;
  str._M_len = local_98._8_8_;
  base_blob<256U>::SetHexDeprecated(&rv.super_base_blob<256U>,str);
  UintToArith256((arith_uint256 *)&local_58,&rv);
  UintToArith256((arith_uint256 *)local_b8,(uint256 *)&R1L);
  auVar22[0] = -(local_b8[0] == (readonly_property<bool>)local_58.super_class_property<bool>.value);
  auVar22[1] = -(local_b8[1] == uStack_57);
  auVar22[2] = -(local_b8[2] == uStack_56);
  auVar22[3] = -(local_b8[3] == uStack_55);
  auVar22[4] = -(local_b8[4] == uStack_54);
  auVar22[5] = -(local_b8[5] == uStack_53);
  auVar22[6] = -(local_b8[6] == uStack_52);
  auVar22[7] = -(local_b8[7] == uStack_51);
  auVar22[8] = -((uchar)sStack_b0.px == uStack_50);
  auVar22[9] = -(sStack_b0.px._1_1_ == uStack_4f);
  auVar22[10] = -(sStack_b0.px._2_1_ == uStack_4e);
  auVar22[0xb] = -(sStack_b0.px._3_1_ == uStack_4d);
  auVar22[0xc] = -(sStack_b0.px._4_1_ == uStack_4c);
  auVar22[0xd] = -(sStack_b0.px._5_1_ == uStack_4b);
  auVar22[0xe] = -(sStack_b0.px._6_1_ == uStack_4a);
  auVar22[0xf] = -(sStack_b0.px._7_1_ == uStack_49);
  auVar8[0] = -((uchar)sStack_b0.pn.pi_ == local_48._M_local_buf[0]);
  auVar8[1] = -(sStack_b0.pn.pi_._1_1_ == local_48._M_local_buf[1]);
  auVar8[2] = -(sStack_b0.pn.pi_._2_1_ == local_48._M_local_buf[2]);
  auVar8[3] = -(sStack_b0.pn.pi_._3_1_ == local_48._M_local_buf[3]);
  auVar8[4] = -(sStack_b0.pn.pi_._4_1_ == local_48._M_local_buf[4]);
  auVar8[5] = -(sStack_b0.pn.pi_._5_1_ == local_48._M_local_buf[5]);
  auVar8[6] = -(sStack_b0.pn.pi_._6_1_ == local_48._M_local_buf[6]);
  auVar8[7] = -(sStack_b0.pn.pi_._7_1_ == local_48._M_local_buf[7]);
  auVar8[8] = -(uStack_a0 == local_48._M_local_buf[8]);
  auVar8[9] = -(uStack_9f == local_48._M_local_buf[9]);
  auVar8[10] = -(uStack_9e == local_48._M_local_buf[10]);
  auVar8[0xb] = -(uStack_9d == local_48._M_local_buf[0xb]);
  auVar8[0xc] = -(uStack_9c == local_48._M_local_buf[0xc]);
  auVar8[0xd] = -(uStack_9b == local_48._M_local_buf[0xd]);
  auVar8[0xe] = -(uStack_9a == local_48._M_local_buf[0xe]);
  auVar8[0xf] = -(uStack_99 == local_48._M_local_buf[0xf]);
  auVar8 = auVar8 & auVar22;
  local_118.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)
       ((ushort)((ushort)(SUB161(auVar8 >> 7,0) & 1) | (ushort)(SUB161(auVar8 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar8 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar8 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar8 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar8 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar8 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar8 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar8 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar8 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar8 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar8 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar8 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar8 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar8 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar8[0xf] >> 7) << 0xf) == 0xffff);
  local_118.m_message.px = (element_type *)0x0;
  local_118.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_128._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_128._8_8_ = "";
  local_c0 = &local_100;
  local_d0 = 0;
  local_d8 = &PTR__lazy_ostream_013d46d8;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_013d46d8;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  local_130 = (arith_uint256 *)local_b8;
  local_100 = (string *)&local_58;
  local_e0 = (string **)&local_130;
  boost::test_tools::tt_detail::report_assertion
            (&local_118,&local_170,1,2,REQUIRE,0xf97335,(size_t)local_128,0x115,&local_d8,
             "UintToArith256(R1L)",&local_f8);
  boost::detail::shared_count::~shared_count(&local_118.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._0_8_ != &aStack_88) {
    operator_delete((void *)local_98._0_8_,(ulong)(aStack_88._M_allocated_capacity + 1));
  }
  local_280 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_278 = "";
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  local_288 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x116;
  file_08.m_begin = (iterator)&local_280;
  msg_08.m_end = pvVar6;
  msg_08.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_290,
             msg_08);
  local_170.m_empty = false;
  local_170._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_160 = boost::unit_test::lazy_ostream::inst;
  local_158 = "";
  base_blob<256u>::GetHex_abi_cxx11_((string *)local_98,&R2L);
  rv.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  rv.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  str_00._M_str = (char *)local_98._0_8_;
  str_00._M_len = local_98._8_8_;
  base_blob<256U>::SetHexDeprecated(&rv.super_base_blob<256U>,str_00);
  UintToArith256((arith_uint256 *)&local_58,&rv);
  UintToArith256((arith_uint256 *)local_b8,(uint256 *)&R2L);
  auVar23[0] = -(local_b8[0] == (readonly_property<bool>)local_58.super_class_property<bool>.value);
  auVar23[1] = -(local_b8[1] == uStack_57);
  auVar23[2] = -(local_b8[2] == uStack_56);
  auVar23[3] = -(local_b8[3] == uStack_55);
  auVar23[4] = -(local_b8[4] == uStack_54);
  auVar23[5] = -(local_b8[5] == uStack_53);
  auVar23[6] = -(local_b8[6] == uStack_52);
  auVar23[7] = -(local_b8[7] == uStack_51);
  auVar23[8] = -((uchar)sStack_b0.px == uStack_50);
  auVar23[9] = -(sStack_b0.px._1_1_ == uStack_4f);
  auVar23[10] = -(sStack_b0.px._2_1_ == uStack_4e);
  auVar23[0xb] = -(sStack_b0.px._3_1_ == uStack_4d);
  auVar23[0xc] = -(sStack_b0.px._4_1_ == uStack_4c);
  auVar23[0xd] = -(sStack_b0.px._5_1_ == uStack_4b);
  auVar23[0xe] = -(sStack_b0.px._6_1_ == uStack_4a);
  auVar23[0xf] = -(sStack_b0.px._7_1_ == uStack_49);
  auVar9[0] = -((uchar)sStack_b0.pn.pi_ == local_48._M_local_buf[0]);
  auVar9[1] = -(sStack_b0.pn.pi_._1_1_ == local_48._M_local_buf[1]);
  auVar9[2] = -(sStack_b0.pn.pi_._2_1_ == local_48._M_local_buf[2]);
  auVar9[3] = -(sStack_b0.pn.pi_._3_1_ == local_48._M_local_buf[3]);
  auVar9[4] = -(sStack_b0.pn.pi_._4_1_ == local_48._M_local_buf[4]);
  auVar9[5] = -(sStack_b0.pn.pi_._5_1_ == local_48._M_local_buf[5]);
  auVar9[6] = -(sStack_b0.pn.pi_._6_1_ == local_48._M_local_buf[6]);
  auVar9[7] = -(sStack_b0.pn.pi_._7_1_ == local_48._M_local_buf[7]);
  auVar9[8] = -(uStack_a0 == local_48._M_local_buf[8]);
  auVar9[9] = -(uStack_9f == local_48._M_local_buf[9]);
  auVar9[10] = -(uStack_9e == local_48._M_local_buf[10]);
  auVar9[0xb] = -(uStack_9d == local_48._M_local_buf[0xb]);
  auVar9[0xc] = -(uStack_9c == local_48._M_local_buf[0xc]);
  auVar9[0xd] = -(uStack_9b == local_48._M_local_buf[0xd]);
  auVar9[0xe] = -(uStack_9a == local_48._M_local_buf[0xe]);
  auVar9[0xf] = -(uStack_99 == local_48._M_local_buf[0xf]);
  auVar9 = auVar9 & auVar23;
  local_118.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)
       ((ushort)((ushort)(SUB161(auVar9 >> 7,0) & 1) | (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar9 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar9 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar9 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar9 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar9 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar9 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar9 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar9 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar9 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar9 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar9 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar9 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar9 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar9[0xf] >> 7) << 0xf) == 0xffff);
  local_118.m_message.px = (element_type *)0x0;
  local_118.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_128._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_128._8_8_ = "";
  local_d0 = 0;
  local_d8 = &PTR__lazy_ostream_013d46d8;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_c0 = &local_100;
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_013d46d8;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  local_130 = (arith_uint256 *)local_b8;
  local_100 = (string *)&local_58;
  local_e0 = (string **)&local_130;
  boost::test_tools::tt_detail::report_assertion
            (&local_118,&local_170,1,2,REQUIRE,0xf9737f,(size_t)local_128,0x116,&local_d8,
             "UintToArith256(R2L)",&local_f8);
  boost::detail::shared_count::~shared_count(&local_118.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._0_8_ != &aStack_88) {
    operator_delete((void *)local_98._0_8_,(ulong)(aStack_88._M_allocated_capacity + 1));
  }
  local_2a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_298 = "";
  local_2b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x117;
  file_09.m_begin = (iterator)&local_2a0;
  msg_09.m_end = pvVar6;
  msg_09.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_2b0,
             msg_09);
  local_170.m_empty = false;
  local_170._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_160 = boost::unit_test::lazy_ostream::inst;
  local_158 = "";
  base_blob<256u>::GetHex_abi_cxx11_((string *)&local_58,&R1L);
  UintToArith256((arith_uint256 *)local_98,(uint256 *)&R1L);
  base_uint<256u>::GetHex_abi_cxx11_((string *)&rv,local_98);
  sVar2 = CONCAT17(uStack_49,
                   CONCAT16(uStack_4a,
                            CONCAT15(uStack_4b,
                                     CONCAT14(uStack_4c,
                                              CONCAT13(uStack_4d,
                                                       CONCAT12(uStack_4e,
                                                                CONCAT11(uStack_4f,uStack_50)))))));
  if (sVar2 == rv.super_base_blob<256U>.m_data._M_elems._8_8_) {
    if (sVar2 == 0) {
      rVar7.super_class_property<bool>.value = (class_property<bool>)true;
    }
    else {
      iVar4 = bcmp((void *)CONCAT17(uStack_51,
                                    CONCAT16(uStack_52,
                                             CONCAT15(uStack_53,
                                                      CONCAT14(uStack_54,
                                                               CONCAT13(uStack_55,
                                                                        CONCAT12(uStack_56,
                                                                                 CONCAT11(uStack_57,
                                                                                          local_58.
                                                  super_class_property<bool>.value))))))),
                   (void *)CONCAT44(rv.super_base_blob<256U>.m_data._M_elems._4_4_,
                                    rv.super_base_blob<256U>.m_data._M_elems._0_4_),sVar2);
      rVar7.super_class_property<bool>.value = (class_property<bool>)(iVar4 == 0);
    }
  }
  else {
    rVar7.super_class_property<bool>.value = (class_property<bool>)false;
  }
  local_b8[0] = (readonly_property<bool>)
                (readonly_property<bool>)rVar7.super_class_property<bool>.value;
  sStack_b0.px = (element_type *)0x0;
  sStack_b0.pn.pi_ = (sp_counted_base *)0x0;
  local_118._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_118.m_message.px = (element_type *)0xf966cf;
  local_d0 = 0;
  local_d8 = &PTR__lazy_ostream_013d3d70;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_013d3d70;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = &local_100;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  local_128._0_8_ = (string *)&local_58;
  local_100 = (string *)&rv;
  local_c0 = (string **)local_128;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_b8,&local_170,1,2,REQUIRE,0xf96c52,(size_t)&local_118,0x117,
             &local_d8,"UintToArith256(R1L).GetHex()",&local_f8);
  boost::detail::shared_count::~shared_count(&sStack_b0.pn);
  if ((undefined1 *)
      CONCAT44(rv.super_base_blob<256U>.m_data._M_elems._4_4_,
               rv.super_base_blob<256U>.m_data._M_elems._0_4_) !=
      rv.super_base_blob<256U>.m_data._M_elems + 0x10) {
    operator_delete((undefined1 *)
                    CONCAT44(rv.super_base_blob<256U>.m_data._M_elems._4_4_,
                             rv.super_base_blob<256U>.m_data._M_elems._0_4_),
                    CONCAT44(rv.super_base_blob<256U>.m_data._M_elems._20_4_,
                             rv.super_base_blob<256U>.m_data._M_elems._16_4_) + 1);
  }
  paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)CONCAT17(uStack_51,
                       CONCAT16(uStack_52,
                                CONCAT15(uStack_53,
                                         CONCAT14(uStack_54,
                                                  CONCAT13(uStack_55,
                                                           CONCAT12(uStack_56,
                                                                    CONCAT11(uStack_57,
                                                                             local_58.
                                                  super_class_property<bool>.value)))))));
  if (paVar1 != &local_48) {
    operator_delete(paVar1,CONCAT17(local_48._M_local_buf[7],
                                    CONCAT16(local_48._M_local_buf[6],
                                             CONCAT15(local_48._M_local_buf[5],
                                                      CONCAT14(local_48._M_local_buf[4],
                                                               CONCAT13(local_48._M_local_buf[3],
                                                                        CONCAT12(local_48.
                                                  _M_local_buf[2],
                                                  CONCAT11(local_48._M_local_buf[1],
                                                           local_48._M_local_buf[0]))))))) + 1);
  }
  local_2c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp";
  local_2b8 = "";
  local_2d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0x118;
  file_10.m_begin = (iterator)&local_2c0;
  msg_10.m_end = pvVar6;
  msg_10.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_2d0,
             msg_10);
  local_170.m_empty = false;
  local_170._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_160 = boost::unit_test::lazy_ostream::inst;
  local_158 = "";
  base_blob<256u>::GetHex_abi_cxx11_((string *)&local_58,&R2L);
  UintToArith256((arith_uint256 *)local_98,(uint256 *)&R2L);
  base_uint<256u>::GetHex_abi_cxx11_((string *)&rv,local_98);
  sVar2 = CONCAT17(uStack_49,
                   CONCAT16(uStack_4a,
                            CONCAT15(uStack_4b,
                                     CONCAT14(uStack_4c,
                                              CONCAT13(uStack_4d,
                                                       CONCAT12(uStack_4e,
                                                                CONCAT11(uStack_4f,uStack_50)))))));
  if (sVar2 == rv.super_base_blob<256U>.m_data._M_elems._8_8_) {
    if (sVar2 == 0) {
      rVar7.super_class_property<bool>.value = (class_property<bool>)true;
    }
    else {
      iVar4 = bcmp((void *)CONCAT17(uStack_51,
                                    CONCAT16(uStack_52,
                                             CONCAT15(uStack_53,
                                                      CONCAT14(uStack_54,
                                                               CONCAT13(uStack_55,
                                                                        CONCAT12(uStack_56,
                                                                                 CONCAT11(uStack_57,
                                                                                          local_58.
                                                  super_class_property<bool>.value))))))),
                   (void *)CONCAT44(rv.super_base_blob<256U>.m_data._M_elems._4_4_,
                                    rv.super_base_blob<256U>.m_data._M_elems._0_4_),sVar2);
      rVar7.super_class_property<bool>.value = (class_property<bool>)(iVar4 == 0);
    }
  }
  else {
    rVar7.super_class_property<bool>.value = (class_property<bool>)false;
  }
  local_b8[0] = (readonly_property<bool>)
                (readonly_property<bool>)rVar7.super_class_property<bool>.value;
  sStack_b0.px = (element_type *)0x0;
  sStack_b0.pn.pi_ = (sp_counted_base *)0x0;
  local_118._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_118.m_message.px = (element_type *)0xf966cf;
  local_d0 = 0;
  local_d8 = &PTR__lazy_ostream_013d3d70;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_f0 = 0;
  local_f8 = &PTR__lazy_ostream_013d3d70;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = &local_100;
  local_128._0_8_ = (string *)&local_58;
  local_100 = (string *)&rv;
  local_c0 = (string **)local_128;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_b8,&local_170,1,2,REQUIRE,0xf96c5f,(size_t)&local_118,0x118,
             &local_d8,"UintToArith256(R2L).GetHex()",&local_f8);
  boost::detail::shared_count::~shared_count(&sStack_b0.pn);
  if ((undefined1 *)
      CONCAT44(rv.super_base_blob<256U>.m_data._M_elems._4_4_,
               rv.super_base_blob<256U>.m_data._M_elems._0_4_) !=
      rv.super_base_blob<256U>.m_data._M_elems + 0x10) {
    operator_delete((undefined1 *)
                    CONCAT44(rv.super_base_blob<256U>.m_data._M_elems._4_4_,
                             rv.super_base_blob<256U>.m_data._M_elems._0_4_),
                    CONCAT44(rv.super_base_blob<256U>.m_data._M_elems._20_4_,
                             rv.super_base_blob<256U>.m_data._M_elems._16_4_) + 1);
  }
  paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)CONCAT17(uStack_51,
                       CONCAT16(uStack_52,
                                CONCAT15(uStack_53,
                                         CONCAT14(uStack_54,
                                                  CONCAT13(uStack_55,
                                                           CONCAT12(uStack_56,
                                                                    CONCAT11(uStack_57,
                                                                             local_58.
                                                  super_class_property<bool>.value)))))));
  if (paVar1 != &local_48) {
    operator_delete(paVar1,CONCAT17(local_48._M_local_buf[7],
                                    CONCAT16(local_48._M_local_buf[6],
                                             CONCAT15(local_48._M_local_buf[5],
                                                      CONCAT14(local_48._M_local_buf[4],
                                                               CONCAT13(local_48._M_local_buf[3],
                                                                        CONCAT12(local_48.
                                                  _M_local_buf[2],
                                                  CONCAT11(local_48._M_local_buf[1],
                                                           local_48._M_local_buf[0]))))))) + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE( conversion )
{
    BOOST_CHECK_EQUAL(ArithToUint256(UintToArith256(ZeroL)), ZeroL);
    BOOST_CHECK_EQUAL(ArithToUint256(UintToArith256(OneL)), OneL);
    BOOST_CHECK_EQUAL(ArithToUint256(UintToArith256(R1L)), R1L);
    BOOST_CHECK_EQUAL(ArithToUint256(UintToArith256(R2L)), R2L);
    BOOST_CHECK_EQUAL(UintToArith256(ZeroL), 0);
    BOOST_CHECK_EQUAL(UintToArith256(OneL), 1);
    BOOST_CHECK_EQUAL(ArithToUint256(0), ZeroL);
    BOOST_CHECK_EQUAL(ArithToUint256(1), OneL);
    BOOST_CHECK_EQUAL(arith_uint256(UintToArith256(uint256S(R1L.GetHex()))), UintToArith256(R1L));
    BOOST_CHECK_EQUAL(arith_uint256(UintToArith256(uint256S(R2L.GetHex()))), UintToArith256(R2L));
    BOOST_CHECK_EQUAL(R1L.GetHex(), UintToArith256(R1L).GetHex());
    BOOST_CHECK_EQUAL(R2L.GetHex(), UintToArith256(R2L).GetHex());
}